

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_util.cc
# Opt level: O1

bool libwebm::ParseVpxCodecPrivate(uint8_t *private_data,int32_t length,Vp9CodecFeatures *features)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  
  bVar7 = false;
  if (((2 < length) && (private_data != (uint8_t *)0x0)) && (features != (Vp9CodecFeatures *)0x0)) {
    *(undefined8 *)features = 0x7fffffff7fffffff;
    *(undefined8 *)(features + 8) = 0x7fffffff7fffffff;
    iVar5 = 0;
    do {
      lVar4 = (long)iVar5;
      lVar6 = lVar4 + 2;
      if (private_data[lVar4 + 1] == '\x01') {
        switch(private_data[lVar4]) {
        case '\x01':
          bVar1 = private_data[lVar6];
          if ((3 < bVar1) ||
             ((*(uint *)features != 0x7fffffff && (*(uint *)features != (uint)bVar1))))
          goto LAB_0011851a;
          *(uint *)features = (uint)bVar1;
LAB_001184e6:
          bVar7 = true;
          iVar2 = iVar5 + 3;
          break;
        case '\x02':
          uVar3 = (uint)private_data[lVar6];
          lVar6 = 0;
          do {
            if (*(uint *)((long)&DAT_00131340 + lVar6) == uVar3) {
              if ((*(uint *)(features + 4) != 0x7fffffff) && (*(uint *)(features + 4) != uVar3))
              goto LAB_0011851a;
              *(uint *)(features + 4) = uVar3;
              break;
            }
            lVar6 = lVar6 + 4;
          } while (lVar6 != 0x38);
          bVar7 = *(int *)(features + 4) != 0x7fffffff;
          iVar2 = iVar5 + 3;
          break;
        case '\x03':
          bVar1 = private_data[lVar6];
          bVar7 = false;
          iVar2 = iVar5 + 3;
          if ((bVar1 < 0xd) && ((0x1500U >> (bVar1 & 0x1f) & 1) != 0)) {
            if ((*(uint *)(features + 8) == 0x7fffffff) || (*(uint *)(features + 8) == (uint)bVar1))
            {
              *(uint *)(features + 8) = (uint)bVar1;
              goto LAB_001184e6;
            }
            goto LAB_0011851a;
          }
          break;
        case '\x04':
          uVar3 = (uint)private_data[lVar6];
          if ((uVar3 < 4) &&
             ((*(uint *)(features + 0xc) == 0x7fffffff || (*(uint *)(features + 0xc) == uVar3)))) {
            *(uint *)(features + 0xc) = uVar3;
            goto LAB_001184e6;
          }
LAB_0011851a:
          bVar7 = false;
          iVar2 = iVar5 + 3;
          break;
        default:
          goto switchD_0011845c_default;
        }
      }
      else {
switchD_0011845c_default:
        bVar7 = false;
        iVar2 = (int)lVar6;
      }
      iVar5 = iVar2;
    } while ((bVar7 != false) && (iVar5 + 3 <= length));
  }
  return bVar7;
}

Assistant:

bool ParseVpxCodecPrivate(const uint8_t* private_data, int32_t length,
                          Vp9CodecFeatures* features) {
  const int kVpxCodecPrivateMinLength = 3;
  if (!private_data || !features || length < kVpxCodecPrivateMinLength)
    return false;

  const uint8_t kVp9ProfileId = 1;
  const uint8_t kVp9LevelId = 2;
  const uint8_t kVp9BitDepthId = 3;
  const uint8_t kVp9ChromaSubsamplingId = 4;
  const int kVpxFeatureLength = 1;
  int offset = 0;

  // Set features to not set.
  features->profile = Vp9CodecFeatures::kValueNotPresent;
  features->level = Vp9CodecFeatures::kValueNotPresent;
  features->bit_depth = Vp9CodecFeatures::kValueNotPresent;
  features->chroma_subsampling = Vp9CodecFeatures::kValueNotPresent;
  do {
    const uint8_t id_byte = private_data[offset++];
    const uint8_t length_byte = private_data[offset++];
    if (length_byte != kVpxFeatureLength)
      return false;
    if (id_byte == kVp9ProfileId) {
      const int priv_profile = static_cast<int>(private_data[offset++]);
      if (priv_profile < 0 || priv_profile > 3)
        return false;
      if (features->profile != Vp9CodecFeatures::kValueNotPresent &&
          features->profile != priv_profile) {
        return false;
      }
      features->profile = priv_profile;
    } else if (id_byte == kVp9LevelId) {
      const int priv_level = static_cast<int>(private_data[offset++]);

      const int kNumLevels = 14;
      const int levels[kNumLevels] = {10, 11, 20, 21, 30, 31, 40,
                                      41, 50, 51, 52, 60, 61, 62};

      for (int i = 0; i < kNumLevels; ++i) {
        if (priv_level == levels[i]) {
          if (features->level != Vp9CodecFeatures::kValueNotPresent &&
              features->level != priv_level) {
            return false;
          }
          features->level = priv_level;
          break;
        }
      }
      if (features->level == Vp9CodecFeatures::kValueNotPresent)
        return false;
    } else if (id_byte == kVp9BitDepthId) {
      const int priv_profile = static_cast<int>(private_data[offset++]);
      if (priv_profile != 8 && priv_profile != 10 && priv_profile != 12)
        return false;
      if (features->bit_depth != Vp9CodecFeatures::kValueNotPresent &&
          features->bit_depth != priv_profile) {
        return false;
      }
      features->bit_depth = priv_profile;
    } else if (id_byte == kVp9ChromaSubsamplingId) {
      const int priv_profile = static_cast<int>(private_data[offset++]);
      if (priv_profile != 0 && priv_profile != 1 && priv_profile != 2 &&
          priv_profile != 3)
        return false;
      if (features->chroma_subsampling != Vp9CodecFeatures::kValueNotPresent &&
          features->chroma_subsampling != priv_profile) {
        return false;
      }
      features->chroma_subsampling = priv_profile;
    } else {
      // Invalid ID.
      return false;
    }
  } while (offset + kVpxCodecPrivateMinLength <= length);

  return true;
}